

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O2

void printPredicateOperand(MCInst *MI,uint OpNo,SStream *O,char *Modifier)

{
  arm64_cc aVar1;
  MCOperand *op;
  ulong uVar2;
  undefined4 in_register_00000034;
  char *s;
  arm64_cc aStack_20;
  
  op = MCInst_getOperand(MI,0);
  uVar2 = MCOperand_getImm(op);
  aVar1 = (arm64_cc)uVar2;
  aStack_20 = aVar1;
  switch(aVar1 - ARM64_CC_PL) {
  case ARM64_CC_INVALID:
  case ARM64_CC_EQ:
    aStack_20 = ARM64_CC_LO;
    break;
  case ARM64_CC_NE:
  case ARM64_CC_HS:
  case ARM64_CC_LO:
  case ARM64_CC_MI:
  case ARM64_CC_PL:
  case ARM64_CC_VS:
    break;
  case ARM64_CC_VC:
  case ARM64_CC_HI:
    aStack_20 = ARM64_CC_LT;
    break;
  default:
    switch(aVar1) {
    case 0x26:
    case 0x27:
      aStack_20 = 0x24;
      break;
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
      break;
    case 0x2e:
    case 0x2f:
      aStack_20 = 0x2c;
      break;
    default:
      switch(aVar1) {
      case 0x46:
      case 0x47:
        aStack_20 = 0x44;
        break;
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
        break;
      case 0x4e:
      case 0x4f:
        aStack_20 = 0x4c;
        break;
      default:
        switch(aVar1) {
        case 0x66:
        case 0x67:
          aStack_20 = 100;
          break;
        case 0x6e:
        case 0x6f:
          aStack_20 = 0x6c;
        }
      }
    }
  }
  (MI->flat_insn->detail->field_6).arm64.cc = aStack_20;
  if (O->buffer[0] != 'p') {
    if (((O->buffer[0] != 'c') || (O->buffer[1] != 'c')) || (O->buffer[2] != '\0'))
    goto LAB_0020f90e;
    if (aVar1 < 0x30) {
      if ((0xd0UL >> (uVar2 & 0x3f) & 1) != 0) {
        s = "ge";
        goto LAB_0020fa55;
      }
      if ((0xd000000000U >> (uVar2 & 0x3f) & 1) != 0) {
        s = "le";
        goto LAB_0020fa55;
      }
      if ((0xd00000000000U >> (uVar2 & 0x3f) & 1) != 0) {
        s = "gt";
        goto LAB_0020fa55;
      }
    }
    uVar2 = (ulong)(aVar1 - 0x4c);
    if (aVar1 - 0x4c < 0x24) {
      if ((0xdUL >> (uVar2 & 0x3f) & 1) != 0) {
        s = "eq";
        goto LAB_0020fa55;
      }
      if ((0xd000000UL >> (uVar2 & 0x3f) & 1) != 0) {
        s = "nu";
        goto LAB_0020fa55;
      }
      if ((0xd00000000U >> (uVar2 & 0x3f) & 1) != 0) {
        s = "un";
        goto LAB_0020fa55;
      }
    }
    if (1 < aVar1 - 0x46) {
      if (aVar1 - 0x400 < 2) {
LAB_0020fa3f:
        s = "invalid-predicate";
        goto LAB_0020fa55;
      }
      if (aVar1 != 0x44) {
        s = "lt";
        goto LAB_0020fa55;
      }
    }
    s = "ne";
    goto LAB_0020fa55;
  }
  if ((O->buffer[1] != 'm') || (O->buffer[2] != '\0')) {
LAB_0020f90e:
    printOperand(MI,1,(SStream *)CONCAT44(in_register_00000034,OpNo));
    return;
  }
  switch(aVar1 - ARM64_CC_PL) {
  case ARM64_CC_INVALID:
  case ARM64_CC_VC:
switchD_0020f95c_caseD_66:
    s = "-";
    break;
  case ARM64_CC_EQ:
  case ARM64_CC_HI:
switchD_0020f95c_caseD_67:
    s = "+";
    break;
  case ARM64_CC_NE:
  case ARM64_CC_HS:
  case ARM64_CC_LO:
  case ARM64_CC_MI:
  case ARM64_CC_PL:
  case ARM64_CC_VS:
switchD_0020f95c_caseD_68:
    return;
  default:
    switch(aVar1) {
    case 0x26:
    case 0x2e:
      goto switchD_0020f95c_caseD_66;
    case 0x27:
    case 0x2f:
      goto switchD_0020f95c_caseD_67;
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
      goto switchD_0020f95c_caseD_68;
    default:
      switch(aVar1) {
      case 0x46:
      case 0x4e:
        goto switchD_0020f95c_caseD_66;
      case 0x47:
      case 0x4f:
        goto switchD_0020f95c_caseD_67;
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
        goto switchD_0020f95c_caseD_68;
      default:
        switch(aVar1) {
        case 0x66:
        case 0x6e:
          goto switchD_0020f95c_caseD_66;
        case 0x67:
        case 0x6f:
          goto switchD_0020f95c_caseD_67;
        case 0x68:
        case 0x69:
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
          goto switchD_0020f95c_caseD_68;
        default:
          if (1 < aVar1 - 0x400) {
            return;
          }
          goto LAB_0020fa3f;
        }
      }
    }
  }
LAB_0020fa55:
  SStream_concat0((SStream *)CONCAT44(in_register_00000034,OpNo),s);
  return;
}

Assistant:

static void printPredicateOperand(MCInst *MI, unsigned OpNo,
		SStream *O, const char *Modifier)
{
	unsigned Code = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNo));

	MI->flat_insn->detail->ppc.bc = (ppc_bc)cc_normalize(Code);

	if (!strcmp(Modifier, "cc")) {
		switch ((ppc_predicate)Code) {
			default:	// unreachable
			case PPC_PRED_LT_MINUS:
			case PPC_PRED_LT_PLUS:
			case PPC_PRED_LT:
				SStream_concat0(O, "lt");
				return;
			case PPC_PRED_LE_MINUS:
			case PPC_PRED_LE_PLUS:
			case PPC_PRED_LE:
				SStream_concat0(O, "le");
				return;
			case PPC_PRED_EQ_MINUS:
			case PPC_PRED_EQ_PLUS:
			case PPC_PRED_EQ:
				SStream_concat0(O, "eq");
				return;
			case PPC_PRED_GE_MINUS:
			case PPC_PRED_GE_PLUS:
			case PPC_PRED_GE:
				SStream_concat0(O, "ge");
				return;
			case PPC_PRED_GT_MINUS:
			case PPC_PRED_GT_PLUS:
			case PPC_PRED_GT:
				SStream_concat0(O, "gt");
				return;
			case PPC_PRED_NE_MINUS:
			case PPC_PRED_NE_PLUS:
			case PPC_PRED_NE:
				SStream_concat0(O, "ne");
				return;
			case PPC_PRED_UN_MINUS:
			case PPC_PRED_UN_PLUS:
			case PPC_PRED_UN:
				SStream_concat0(O, "un");
				return;
			case PPC_PRED_NU_MINUS:
			case PPC_PRED_NU_PLUS:
			case PPC_PRED_NU:
				SStream_concat0(O, "nu");
				return;
			case PPC_PRED_BIT_SET:
			case PPC_PRED_BIT_UNSET:
				// llvm_unreachable("Invalid use of bit predicate code");
				SStream_concat0(O, "invalid-predicate");
				return;
		}
	}

	if (!strcmp(Modifier, "pm")) {
		switch ((ppc_predicate)Code) {
			case PPC_PRED_LT:
			case PPC_PRED_LE:
			case PPC_PRED_EQ:
			case PPC_PRED_GE:
			case PPC_PRED_GT:
			case PPC_PRED_NE:
			case PPC_PRED_UN:
			case PPC_PRED_NU:
				return;
			case PPC_PRED_LT_MINUS:
			case PPC_PRED_LE_MINUS:
			case PPC_PRED_EQ_MINUS:
			case PPC_PRED_GE_MINUS:
			case PPC_PRED_GT_MINUS:
			case PPC_PRED_NE_MINUS:
			case PPC_PRED_UN_MINUS:
			case PPC_PRED_NU_MINUS:
				SStream_concat0(O, "-");
				return;
			case PPC_PRED_LT_PLUS:
			case PPC_PRED_LE_PLUS:
			case PPC_PRED_EQ_PLUS:
			case PPC_PRED_GE_PLUS:
			case PPC_PRED_GT_PLUS:
			case PPC_PRED_NE_PLUS:
			case PPC_PRED_UN_PLUS:
			case PPC_PRED_NU_PLUS:
				SStream_concat0(O, "+");
				return;
			case PPC_PRED_BIT_SET:
			case PPC_PRED_BIT_UNSET:
				// llvm_unreachable("Invalid use of bit predicate code");
				SStream_concat0(O, "invalid-predicate");
				return;
			default:	// unreachable
				return;
		}
		// llvm_unreachable("Invalid predicate code");
	}

	//assert(StringRef(Modifier) == "reg" &&
	//		"Need to specify 'cc', 'pm' or 'reg' as predicate op modifier!");
	printOperand(MI, OpNo + 1, O);
}